

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O2

int nn_global_create_ep(nn_sock *sock,char *addr,int bind)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  nn_list_item *it;
  nn_list_item *pnVar5;
  
  iVar2 = -0x16;
  if (addr != (char *)0x0) {
    sVar3 = strlen(addr);
    if (sVar3 < 0x80) {
      pcVar4 = strchr(addr,0x3a);
      if (((pcVar4 != (char *)0x0) && (pcVar4[1] == '/')) && (pcVar4[2] == '/')) {
        it = nn_list_begin(&self.transports);
        iVar2 = -0x5d;
        while( true ) {
          pnVar5 = nn_list_end(&self.transports);
          if (it == pnVar5) break;
          pnVar5 = it[-4].prev;
          sVar3 = strlen((char *)pnVar5);
          if (sVar3 == (long)pcVar4 - (long)addr) {
            iVar1 = bcmp(pnVar5,addr,(long)pcVar4 - (long)addr);
            if (iVar1 == 0) {
              iVar2 = nn_sock_add_ep(sock,(nn_transport *)&it[-4].prev,bind,pcVar4 + 3);
              return iVar2;
            }
          }
          it = nn_list_next(&self.transports,it);
        }
      }
    }
    else {
      iVar2 = -0x24;
    }
  }
  return iVar2;
}

Assistant:

static int nn_global_create_ep (struct nn_sock *sock, const char *addr,
    int bind)
{
    int rc;
    const char *proto;
    const char *delim;
    size_t protosz;
    struct nn_transport *tp;
    struct nn_list_item *it;

    /*  Check whether address is valid. */
    if (!addr)
        return -EINVAL;
    if (strlen (addr) >= NN_SOCKADDR_MAX)
        return -ENAMETOOLONG;

    /*  Separate the protocol and the actual address. */
    proto = addr;
    delim = strchr (addr, ':');
    if (!delim)
        return -EINVAL;
    if (delim [1] != '/' || delim [2] != '/')
        return -EINVAL;
    protosz = delim - addr;
    addr += protosz + 3;

    /*  Find the specified protocol. */
    tp = NULL;
    for (it = nn_list_begin (&self.transports);
          it != nn_list_end (&self.transports);
          it = nn_list_next (&self.transports, it)) {
        tp = nn_cont (it, struct nn_transport, item);
        if (strlen (tp->name) == protosz &&
              memcmp (tp->name, proto, protosz) == 0)
            break;
        tp = NULL;
    }

    /*  The protocol specified doesn't match any known protocol. */
    if (!tp) {
        return -EPROTONOSUPPORT;
    }

    /*  Ask the socket to create the endpoint. */
    rc = nn_sock_add_ep (sock, tp, bind, addr);
    return rc;
}